

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O1

void DrawCircleSector(Vector2 center,float radius,float startAngle,float endAngle,int segments,
                     Color color)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined4 local_74;
  undefined4 local_58;
  undefined4 uStack_54;
  
  uVar4 = (ulong)(uint)segments;
  fVar8 = (float)(~-(uint)(0.0 < radius) & 0x3dcccccd | (uint)radius & -(uint)(0.0 < radius));
  local_74 = endAngle;
  if (startAngle <= endAngle) {
    local_74 = startAngle;
    startAngle = endAngle;
  }
  fVar5 = startAngle - local_74;
  fVar6 = ceilf(fVar5 / 90.0);
  if (segments < (int)fVar6) {
    fVar7 = -0.5 / fVar8 + 1.0;
    fVar7 = fVar7 * fVar7;
    fVar7 = acosf(fVar7 + fVar7 + -1.0);
    fVar7 = ceilf(6.2831855 / fVar7);
    uVar2 = (uint)((fVar7 * fVar5) / 360.0);
    uVar1 = (int)fVar6;
    if (0 < (int)uVar2) {
      uVar1 = uVar2;
    }
    uVar4 = (ulong)uVar1;
  }
  iVar3 = (int)uVar4;
  fVar5 = fVar5 / (float)iVar3;
  rlCheckRenderBatchLimit(iVar3 * 2);
  rlSetTexture(texShapes.id);
  rlBegin(7);
  uStack_54 = center.y;
  local_58 = center.x;
  if (1 < iVar3) {
    iVar3 = (int)(uVar4 >> 0x1f) + iVar3 >> 1;
    do {
      rlColor4ub(color.r,color.g,color.b,color.a);
      rlTexCoord2f(texShapesRec.x / (float)texShapes.width,texShapesRec.y / (float)texShapes.height)
      ;
      rlVertex2f(local_58,uStack_54);
      rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                   (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
      fVar6 = sinf(local_74 * 0.017453292);
      fVar7 = cosf(local_74 * 0.017453292);
      rlVertex2f(fVar6 * fVar8 + local_58,fVar7 * fVar8 + uStack_54);
      rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                   (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
      fVar6 = (fVar5 + local_74) * 0.017453292;
      fVar7 = sinf(fVar6);
      fVar6 = cosf(fVar6);
      rlVertex2f(fVar7 * fVar8 + local_58,fVar6 * fVar8 + uStack_54);
      rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                   texShapesRec.y / (float)texShapes.height);
      local_74 = local_74 + fVar5 + fVar5;
      fVar6 = sinf(local_74 * 0.017453292);
      fVar7 = cosf(local_74 * 0.017453292);
      rlVertex2f(fVar6 * fVar8 + local_58,fVar7 * fVar8 + uStack_54);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  if ((uVar4 & 1) != 0) {
    rlColor4ub(color.r,color.g,color.b,color.a);
    rlTexCoord2f(texShapesRec.x / (float)texShapes.width,texShapesRec.y / (float)texShapes.height);
    rlVertex2f(local_58,uStack_54);
    rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                 (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
    fVar6 = sinf(local_74 * 0.017453292);
    fVar7 = cosf(local_74 * 0.017453292);
    rlVertex2f(fVar6 * fVar8 + local_58,fVar7 * fVar8 + uStack_54);
    rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                 (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
    fVar5 = (fVar5 + local_74) * 0.017453292;
    fVar6 = sinf(fVar5);
    fVar5 = cosf(fVar5);
    rlVertex2f(fVar6 * fVar8 + local_58,fVar8 * fVar5 + uStack_54);
    rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                 texShapesRec.y / (float)texShapes.height);
    rlVertex2f(local_58,uStack_54);
  }
  rlEnd();
  rlSetTexture(0);
  return;
}

Assistant:

void DrawCircleSector(Vector2 center, float radius, float startAngle, float endAngle, int segments, Color color)
{
    if (radius <= 0.0f) radius = 0.1f;  // Avoid div by zero

    // Function expects (endAngle > startAngle)
    if (endAngle < startAngle)
    {
        // Swap values
        float tmp = startAngle;
        startAngle = endAngle;
        endAngle = tmp;
    }

    int minSegments = (int)ceilf((endAngle - startAngle)/90);

    if (segments < minSegments)
    {
        // Calculate the maximum angle between segments based on the error rate (usually 0.5f)
        float th = acosf(2*powf(1 - SMOOTH_CIRCLE_ERROR_RATE/radius, 2) - 1);
        segments = (int)((endAngle - startAngle)*ceilf(2*PI/th)/360);

        if (segments <= 0) segments = minSegments;
    }

    float stepLength = (endAngle - startAngle)/(float)segments;
    float angle = startAngle;

#if defined(SUPPORT_QUADS_DRAW_MODE)
    rlCheckRenderBatchLimit(4*segments/2);

    rlSetTexture(texShapes.id);

    rlBegin(RL_QUADS);
        // NOTE: Every QUAD actually represents two segments
        for (int i = 0; i < segments/2; i++)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);

            rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
            rlVertex2f(center.x, center.y);

            rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
            rlVertex2f(center.x + sinf(DEG2RAD*angle)*radius, center.y + cosf(DEG2RAD*angle)*radius);

            rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
            rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength))*radius, center.y + cosf(DEG2RAD*(angle + stepLength))*radius);

            rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
            rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength*2))*radius, center.y + cosf(DEG2RAD*(angle + stepLength*2))*radius);

            angle += (stepLength*2);
        }

        // NOTE: In case number of segments is odd, we add one last piece to the cake
        if (segments%2)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);

            rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
            rlVertex2f(center.x, center.y);

            rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
            rlVertex2f(center.x + sinf(DEG2RAD*angle)*radius, center.y + cosf(DEG2RAD*angle)*radius);

            rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
            rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength))*radius, center.y + cosf(DEG2RAD*(angle + stepLength))*radius);

            rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
            rlVertex2f(center.x, center.y);
        }
    rlEnd();

    rlSetTexture(0);
#else
    rlCheckRenderBatchLimit(3*segments);

    rlBegin(RL_TRIANGLES);
        for (int i = 0; i < segments; i++)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);

            rlVertex2f(center.x, center.y);
            rlVertex2f(center.x + sinf(DEG2RAD*angle)*radius, center.y + cosf(DEG2RAD*angle)*radius);
            rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength))*radius, center.y + cosf(DEG2RAD*(angle + stepLength))*radius);

            angle += stepLength;
        }
    rlEnd();
#endif
}